

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::setParent_sys(QWidgetPrivate *this,QWidget *newparent,WindowFlags f)

{
  uint uVar1;
  uint uVar2;
  QWidget *parent;
  long lVar3;
  QWExtra *pQVar4;
  long lVar5;
  QWindow *pQVar6;
  QWidgetPrivate *this_00;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var7;
  int *piVar8;
  bool bVar9;
  QDebug QVar10;
  QScreen *pQVar11;
  QWidget *this_01;
  QWidget *pQVar12;
  QWidgetData *pQVar13;
  undefined8 uVar14;
  byte bVar15;
  long lVar16;
  long in_FS_OFFSET;
  bool bVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QFlagsStorage<Qt::WindowType> local_54;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&this->field_0x8;
  uVar1 = (this->data).window_flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  uVar2 = *(uint *)(*(long *)&parent->field_0x8 + 0x240);
  local_54.i = (Int)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                    super_QFlagsStorage<Qt::WindowType>.i;
  if (newparent == (QWidget *)0x0) {
    pQVar11 = (QScreen *)0x0;
  }
  else {
    if ((char)(newparent->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i != '\x11') {
      bVar9 = false;
      setWinId(this,0);
      pQVar11 = (QScreen *)0x0;
      goto LAB_0030c6db;
    }
    pQVar11 = QWidget::screen(newparent);
  }
  setWinId(this,0);
  f.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorageHelper<Qt::WindowType,_4>)
       ((uint)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i |
       1);
  bVar9 = true;
  local_54.i = (Int)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                    super_QFlagsStorage<Qt::WindowType>.i;
  if (*(long *)&this->field_0x10 != 0) {
    pQVar12 = *(QWidget **)(*(long *)&parent->field_0x8 + 0x10);
    do {
      this_01 = pQVar12;
      pQVar12 = *(QWidget **)(*(long *)&this_01->field_0x8 + 0x10);
      if (pQVar12 == (QWidget *)0x0) break;
    } while (((this_01->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
    pQVar11 = QWidget::screen(this_01);
  }
  newparent = (QWidget *)0x0;
LAB_0030c6db:
  if (((uVar1 & 1) == 0) ||
     (((uint)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i &
      1) != 0 || (uVar2 >> 0x1c & 1) == 0)) {
    bVar17 = false;
  }
  else {
    bVar17 = (*(byte *)(*(long *)&parent->field_0x8 + 0x248) & 0x10) == 0;
  }
  if (*(QWidget **)&this->field_0x10 != newparent) {
    QObjectPrivate::setParent_helper((QObject *)this);
    lVar3 = *(long *)(*(long *)&parent->field_0x8 + 0x78);
    if (((lVar3 != 0) && (lVar3 = *(long *)(lVar3 + 8), lVar3 != 0)) &&
       (lVar3 = *(long *)(lVar3 + 0x20), lVar3 != 0)) {
      QWindow::setFlags(lVar3,f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                              super_QFlagsStorage<Qt::WindowType>.i);
    }
    pQVar12 = closestParentWidgetWithWindowHandle(this);
    if (bVar17) {
      reparentWidgetWindowChildren(this,pQVar12);
    }
    else {
      reparentWidgetWindows(this,pQVar12,f);
    }
  }
  if ((*(byte *)(*(long *)(*(long *)&this->field_0x8 + 0x20) + 10) & 1) == 0) {
    bVar15 = 0;
  }
  else {
    bVar15 = (*(byte *)(*(long *)(*(long *)&this->field_0x8 + 8) + 0x244) & 0x20) >> 5;
  }
  if (bVar17) {
    pQVar4 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar4 != (QWExtra *)0x0) && ((pQVar4->field_0x7d & 1) != 0)) {
      QWindowContainer::toplevelAboutToBeDestroyed(parent);
    }
    lVar3 = *(long *)(*(long *)(*(long *)(*(long *)(*(long *)&parent->field_0x8 + 0x78) + 8) + 0x20)
                     + 8);
    lVar5 = *(long *)(lVar3 + 0x28);
    if (lVar5 != 0) {
      closestParentWidgetWithWindowHandle(this);
      lVar3 = *(long *)(lVar3 + 0x20);
      lVar16 = 0;
      do {
        pQVar6 = *(QWindow **)(lVar3 + lVar16);
        if ((pQVar6 != (QWindow *)0x0) && ((*(byte *)(*(long *)(pQVar6 + 8) + 0x30) & 0x40) != 0)) {
          lcWidgetWindow();
          if (((byte)lcWidgetWindow::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1
              ) != 0) {
            QMessageLogger::warning();
            QVar10.stream = local_70.stream;
            QVar18.m_data = &DAT_0000000b;
            QVar18.m_size = (qsizetype)local_50;
            QString::fromUtf8(QVar18);
            QTextStream::operator<<((QTextStream *)QVar10.stream,(QString *)local_50);
            if (local_50[0] != (QArrayData *)0x0) {
              LOCK();
              (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_50[0],2,0x10);
              }
            }
            if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_70.stream,' ');
            }
            local_68.stream = local_70.stream;
            *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
            ::operator<<((Stream *)&local_60,(QWindow *)&local_68);
            QVar10.stream = local_60.stream;
            QVar19.m_data = (storage_type *)0x11;
            QVar19.m_size = (qsizetype)local_50;
            QString::fromUtf8(QVar19);
            QTextStream::operator<<((QTextStream *)QVar10.stream,(QString *)local_50);
            if (local_50[0] != (QArrayData *)0x0) {
              LOCK();
              (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_50[0],2,0x10);
              }
            }
            if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_60.stream,' ');
            }
            QTextStream::operator<<((QTextStream *)local_60.stream,this);
            if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_60.stream,' ');
            }
            QDebug::~QDebug(&local_60);
            QDebug::~QDebug(&local_68);
            QDebug::~QDebug(&local_70);
          }
          QWindow::setParent(pQVar6);
        }
        lVar16 = lVar16 + 8;
      } while (lVar5 << 3 != lVar16);
    }
    QWidget::destroy(parent,true,false);
  }
  adjustFlags((WindowFlags *)&local_54,parent);
  (this->data).window_flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
  super_QFlagsStorage<Qt::WindowType>.i = local_54.i;
  this_00 = *(QWidgetPrivate **)&parent->field_0x8;
  if ((this_00->high_attributes[0] >> 0x1c & 1) != 0) {
    this_00->high_attributes[0] = this_00->high_attributes[0] & 0xefffffff;
  }
  pQVar13 = parent->data;
  if ((pQVar13->widget_attributes & 0x18000) != 0) {
    pQVar13->widget_attributes = pQVar13->widget_attributes & 0xfffe7fff;
  }
  if (((uVar2 >> 0x1c & 1) != 0 && !bVar9) &&
     ((local_54.i & 1) != 0 || (this_00->high_attributes[2] & 0x10) != 0)) {
    createWinId(this_00);
    pQVar13 = parent->data;
  }
  if (((((pQVar13->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0 || bVar9) ||
      ((~bVar15 & (newparent->data->widget_attributes & 0x8000) == 0) == 0)) &&
     ((pQVar13->widget_attributes >> 0x10 & 1) == 0)) {
    pQVar13->widget_attributes = pQVar13->widget_attributes | 0x10000;
  }
  lVar3 = *(long *)&parent->field_0x8;
  if (bVar15 != (byte)((*(uint *)(lVar3 + 0x244) & 0x20) >> 5)) {
    *(uint *)(lVar3 + 0x244) = (uint)bVar15 << 5 | *(uint *)(lVar3 + 0x244) & 0xffffffdf;
  }
  if (bVar9 && pQVar11 != (QScreen *)0x0) {
    if ((*(byte *)(lVar3 + 0x243) & 0x10) == 0) {
      createTLExtra(this);
      _Var7.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
           (((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
           super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
      uVar14 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pQVar11);
      piVar8 = *(int **)((long)_Var7.
                               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                               super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8);
      *(undefined8 *)
       ((long)_Var7.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
              super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8) = uVar14;
      *(QScreen **)
       ((long)_Var7.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
              super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xc0) = pQVar11;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          operator_delete(piVar8);
        }
      }
    }
    else {
      QWindow::setScreen(*(QScreen **)(*(long *)(*(long *)(lVar3 + 0x78) + 8) + 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setParent_sys(QWidget *newparent, Qt::WindowFlags f)
{
    Q_Q(QWidget);

    Qt::WindowFlags oldFlags = data.window_flags;
    bool wasCreated = q->testAttribute(Qt::WA_WState_Created);

    QScreen *targetScreen = nullptr;
    // Handle a request to move the widget to a particular screen
    if (newparent && newparent->windowType() == Qt::Desktop) {
        // make sure the widget is created on the same screen as the
        // programmer specified desktop widget
        targetScreen = newparent->screen();
        newparent = nullptr;
    }

    setWinId(0);

    if (!newparent) {
        f |= Qt::Window;
        if (parent)
            targetScreen = q->parentWidget()->window()->screen();
    }

    const bool destroyWindow = (
        // Reparenting top level to child
        (oldFlags & Qt::Window) && !(f & Qt::Window)
        // And we can dispose of the window
        && wasCreated && !q->testAttribute(Qt::WA_NativeWindow)
    );

    if (parent != newparent) {
        // Update object parent now, so we can resolve new parent window below
        QObjectPrivate::setParent_helper(newparent);

        if (q->windowHandle())
            q->windowHandle()->setFlags(f);

        // If the widget itself or any of its children have been created,
        // we need to reparent their QWindows as well.
        QWidget *parentWithWindow = closestParentWidgetWithWindowHandle();
        // But if the widget is about to be destroyed we must skip the
        // widget itself, and only reparent children.
        if (destroyWindow) {
            reparentWidgetWindowChildren(parentWithWindow);
        } else {
            // During reparentWidgetWindows() we need to know whether the reparented
            // QWindow should be a top level (with a transient parent) or not. This
            // widget has not updated its window flags yet, so we can't ask the widget
            // directly at that point. Nor can we use the QWindow flags, as unlike QWidgets
            // the QWindow flags always reflect Qt::Window, even for child windows. And
            // we can't use QWindow::isTopLevel() either, as that depends on the parent,
            // which we are in the process of updating. So we propagate the
            // new flags of the reparented window here.
            reparentWidgetWindows(parentWithWindow, f);
        }
    }

    bool explicitlyHidden = isExplicitlyHidden();

    if (destroyWindow) {
        if (extra && extra->hasWindowContainer)
            QWindowContainer::toplevelAboutToBeDestroyed(q);

        // There shouldn't be any QWindow children left, but if there
        // are, re-parent them now, before we destroy.
        if (!q->windowHandle()->children().isEmpty()) {
            QWidget *parentWithWindow = closestParentWidgetWithWindowHandle();
            QWindow *newParentWindow = parentWithWindow ? parentWithWindow->windowHandle() : nullptr;
            for (QObject *child : q->windowHandle()->children()) {
                if (QWindow *childWindow = qobject_cast<QWindow *>(child)) {
                    qCWarning(lcWidgetWindow) << "Reparenting" << childWindow
                                              << "before destroying" << this;
                    childWindow->setParent(newParentWindow);
                }
            }
        }

        // We have reparented any child windows of the widget we are
        // about to destroy to the new parent window handle, so we can
        // safely destroy this widget without destroying sub windows.
        q->destroy(true, false);
    }

    adjustFlags(f, q);
    data.window_flags = f;
    q->setAttribute(Qt::WA_WState_Created, false);
    q->setAttribute(Qt::WA_WState_Visible, false);
    q->setAttribute(Qt::WA_WState_Hidden, false);

    if (newparent && wasCreated && (q->testAttribute(Qt::WA_NativeWindow) || (f & Qt::Window)))
        q->createWinId();

    if (q->isWindow() || (!newparent || newparent->isVisible()) || explicitlyHidden)
        q->setAttribute(Qt::WA_WState_Hidden);
    q->setAttribute(Qt::WA_WState_ExplicitShowHide, explicitlyHidden);

    // move the window to the selected screen
    if (!newparent && targetScreen) {
        // only if it is already created
        if (q->testAttribute(Qt::WA_WState_Created))
            q->windowHandle()->setScreen(targetScreen);
        else
            topData()->initialScreen = targetScreen;
    }
}